

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

MeasurementSystem __thiscall QLocale::measurementSystem(QLocale *this)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  QVariant res;
  bool *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  MeasurementSystem local_4c;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4d3650);
  if (pQVar2->m_data == &systemLocaleData) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    ::QVariant::QVariant((QVariant *)0x4d3694);
    (*pQVar3->_vptr_QSystemLocale[2])(&local_28,pQVar3,0x19,local_48);
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    bVar1 = ::QVariant::isNull((QVariant *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar1) {
      local_4c = ::QVariant::toInt((QVariant *)
                                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff68);
    }
    ::QVariant::~QVariant((QVariant *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
    ;
    if (!bVar1) goto LAB_004d376f;
  }
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4d3763);
  local_4c = QLocalePrivate::measurementSystem(in_RDI);
LAB_004d376f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

QLocale::MeasurementSystem QLocale::measurementSystem() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::MeasurementSystem);
        if (!res.isNull())
            return MeasurementSystem(res.toInt());
    }
#endif

    return d->measurementSystem();
}